

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator fmt::v6::
         vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                   (range out,basic_string_view<char> format_str,
                   basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                   args,locale_ref loc)

{
  output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> oVar1;
  basic_string_view<char> format_str_00;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  h;
  undefined1 auStack_78 [8];
  internal *local_70;
  char *local_68;
  undefined4 local_60;
  output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> local_58;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *local_50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_2
  local_48;
  void *local_40;
  undefined4 local_38;
  void *local_30;
  undefined4 local_28;
  undefined4 local_18;
  
  local_48 = args.field_1;
  local_50 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
              *)args.types_;
  local_68 = (char *)format_str.size_;
  local_70 = (internal *)format_str.data_;
  local_60 = 0;
  local_40 = (void *)0x0;
  local_38 = 0;
  local_28 = 0;
  local_18 = 0;
  format_str_00.size_ = (size_t)auStack_78;
  format_str_00.data_ = local_68;
  local_58.it_.container =
       (back_insert_iterator<fmt::v6::internal::buffer<char>_>)
       (back_insert_iterator<fmt::v6::internal::buffer<char>_>)
       out.super_output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>.it_
       .container;
  local_30 = loc.locale_;
  internal::
  parse_format_string<false,char,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>&>
            (local_70,format_str_00,local_50);
  oVar1.it_.container = local_58.it_.container;
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  return (iterator)(buffer<char> *)oVar1.it_.container;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::range out, basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    internal::locale_ref loc = internal::locale_ref()) {
  format_handler<ArgFormatter, Char, Context> h(out, format_str, args, loc);
  internal::parse_format_string<false>(format_str, h);
  return h.context.out();
}